

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.cpp
# Opt level: O0

void __thiscall Clasp::SatPreprocessor::discardClauses(SatPreprocessor *this,bool full)

{
  size_type sVar1;
  size_type sVar2;
  reference ppCVar3;
  byte in_SIL;
  long in_RDI;
  Clause *t;
  Clause *r;
  size_type i;
  pod_vector<Clasp::SatPreprocessor::Clause_*,_std::allocator<Clasp::SatPreprocessor::Clause_*>_>
  *in_stack_ffffffffffffff98;
  Clause *in_stack_ffffffffffffffa0;
  Clause *this_00;
  Range<unsigned_int> local_48;
  pod_vector<Clasp::SatPreprocessor::Clause_*,_std::allocator<Clasp::SatPreprocessor::Clause_*>_>
  *in_stack_ffffffffffffffc0;
  Clause *local_38;
  Clause local_20;
  size_type local_10;
  byte local_9;
  
  local_9 = in_SIL & 1;
  for (local_10 = 0; sVar1 = local_10,
      sVar2 = bk_lib::
              pod_vector<Clasp::SatPreprocessor::Clause_*,_std::allocator<Clasp::SatPreprocessor::Clause_*>_>
              ::size((pod_vector<Clasp::SatPreprocessor::Clause_*,_std::allocator<Clasp::SatPreprocessor::Clause_*>_>
                      *)(in_RDI + 0x30)), sVar1 != sVar2; local_10 = local_10 + 1) {
    ppCVar3 = bk_lib::
              pod_vector<Clasp::SatPreprocessor::Clause_*,_std::allocator<Clasp::SatPreprocessor::Clause_*>_>
              ::operator[]((pod_vector<Clasp::SatPreprocessor::Clause_*,_std::allocator<Clasp::SatPreprocessor::Clause_*>_>
                            *)(in_RDI + 0x30),local_10);
    if (*ppCVar3 != (Clause *)0x0) {
      bk_lib::
      pod_vector<Clasp::SatPreprocessor::Clause_*,_std::allocator<Clasp::SatPreprocessor::Clause_*>_>
      ::operator[]((pod_vector<Clasp::SatPreprocessor::Clause_*,_std::allocator<Clasp::SatPreprocessor::Clause_*>_>
                    *)(in_RDI + 0x30),local_10);
      Clause::destroy(in_stack_ffffffffffffffa0);
    }
  }
  this_00 = &local_20;
  bk_lib::
  pod_vector<Clasp::SatPreprocessor::Clause_*,_std::allocator<Clasp::SatPreprocessor::Clause_*>_>::
  pod_vector(in_stack_ffffffffffffffc0);
  bk_lib::
  pod_vector<Clasp::SatPreprocessor::Clause_*,_std::allocator<Clasp::SatPreprocessor::Clause_*>_>::
  swap((pod_vector<Clasp::SatPreprocessor::Clause_*,_std::allocator<Clasp::SatPreprocessor::Clause_*>_>
        *)this_00,in_stack_ffffffffffffff98);
  bk_lib::
  pod_vector<Clasp::SatPreprocessor::Clause_*,_std::allocator<Clasp::SatPreprocessor::Clause_*>_>::
  ~pod_vector((pod_vector<Clasp::SatPreprocessor::Clause_*,_std::allocator<Clasp::SatPreprocessor::Clause_*>_>
               *)0x1d1153);
  if ((local_9 & 1) == 0) {
    local_38 = (Clause *)0x0;
  }
  else {
    local_38 = *(Clause **)(in_RDI + 0x28);
  }
  if (local_38 != (Clause *)0x0) {
    do {
      local_38 = Clause::next(local_38);
      Clause::destroy(this_00);
    } while (local_38 != (Clause *)0x0);
    *(undefined8 *)(in_RDI + 0x28) = 0;
  }
  if ((local_9 & 1) != 0) {
    Range<unsigned_int>::Range(&local_48,1,1);
    *(Range<unsigned_int> *)(in_RDI + 0x50) = local_48;
  }
  return;
}

Assistant:

void SatPreprocessor::discardClauses(bool full) {
	for (ClauseList::size_type i = 0; i != clauses_.size(); ++i) {
		if (clauses_[i]) { clauses_[i]->destroy(); }
	}
	ClauseList().swap(clauses_);
	if (Clause* r = (full ? elimTop_ : 0)) {
		do {
			Clause* t = r;
			 r = r->next();
			 t->destroy();
		} while (r);
		elimTop_ = 0;
	}
	if (full) { seen_ = Range32(1,1); }
}